

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O0

void __thiscall
FIX::SocketInitiator::SocketInitiator
          (SocketInitiator *this,Application *application,MessageStoreFactory *factory,
          SessionSettings *settings)

{
  SessionSettings *settings_local;
  MessageStoreFactory *factory_local;
  Application *application_local;
  SocketInitiator *this_local;
  
  Initiator::Initiator(&this->super_Initiator,application,factory,settings);
  SocketConnector::Strategy::Strategy(&this->super_Strategy);
  (this->super_Initiator)._vptr_Initiator = (_func_int **)&PTR__SocketInitiator_00331408;
  (this->super_Strategy)._vptr_Strategy = (_func_int **)&PTR__SocketInitiator_00331488;
  SessionSettings::SessionSettings(&this->m_settings);
  HostDetailsProvider::HostDetailsProvider(&this->m_hostDetailsProvider);
  SocketConnector::SocketConnector(&this->m_connector,1);
  std::
  map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
  ::map(&this->m_pendingConnections);
  std::
  map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
  ::map(&this->m_connections);
  this->m_lastConnect = 0;
  this->m_reconnectInterval = 0x1e;
  this->m_noDelay = false;
  this->m_sendBufSize = 0;
  this->m_rcvBufSize = 0;
  return;
}

Assistant:

EXCEPT(ConfigError)
    : Initiator(application, factory, settings),
      m_connector(1),
      m_lastConnect(0),
      m_reconnectInterval(30),
      m_noDelay(false),
      m_sendBufSize(0),
      m_rcvBufSize(0) {}